

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga_x_ak13.c
# Opt level: O3

double xc_gga_ak13_get_asymptotic(double homo)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = cbrt(29.608813203268074);
  dVar3 = (2.47429412719358 / (dVar1 * 3.0)) * 0.9305257363491001;
  dVar3 = dVar3 * dVar3;
  dVar1 = *(double *)(&DAT_00f5f080 + (ulong)(homo < 0.0) * 8);
  dVar2 = (homo * -4.0) / dVar3 + 1.0;
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  return (dVar1 * dVar2 + 1.0) * dVar3 * 0.5;
}

Assistant:

double xc_gga_ak13_get_asymptotic (double homo)
{
  return xc_gga_ak13_pars_get_asymptotic(homo, par_ak13);
}